

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O0

bool __thiscall
m2d::savanna::ssl_reuse::
reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
::completion_callback
          (reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
           *this,result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
                 *result)

{
  bool bVar1;
  uint uVar2;
  pointer_type pmVar3;
  header_type *this_00;
  result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  local_2d0;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  undefined1 local_138 [8];
  url new_url;
  allocator<char> local_61;
  string_view local_60;
  string_view local_50;
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> location;
  result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  *result_local;
  reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  *this_local;
  
  location.field_2._8_8_ = result;
  bVar1 = boost::optional<boost::system::system_error>::operator!(&result->error);
  if (bVar1) {
    pmVar3 = boost::
             optional<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
             ::operator->(&result->response);
    uVar2 = boost::beast::http::
            header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>::result_int
                      (&pmVar3->
                        super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                      );
    if (299 < uVar2) {
      pmVar3 = boost::
               optional<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
               ::operator->(&result->response);
      uVar2 = boost::beast::http::
              header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>::result_int
                        (&pmVar3->
                          super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                        );
      if ((uVar2 < 400) && ((this->follow_location_ & 1U) != 0)) {
        pmVar3 = boost::
                 optional<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
                 ::operator->(&result->response);
        this_00 = boost::beast::http::
                  message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                  ::base(pmVar3);
        boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_60,"Location");
        local_50 = boost::beast::http::basic_fields<std::allocator<char>_>::operator[]
                             (&this_00->super_basic_fields<std::allocator<char>_>,local_60);
        std::allocator<char>::allocator();
        boost::basic_string_view<char,std::char_traits<char>>::to_string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   (basic_string_view<char,std::char_traits<char>> *)&local_50,&local_61);
        std::allocator<char>::~allocator(&local_61);
        std::__cxx11::string::string((string *)&local_158,(string *)local_40);
        url::url((url *)local_138,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        url::to_string_abi_cxx11_(&local_178,(url *)local_138);
        url::host_abi_cxx11_(&local_198,(url *)local_138);
        update_request(this,&this->original_request_,&local_178,&local_198);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_178);
        url::host_abi_cxx11_(&local_1b8,(url *)local_138);
        url::port_str_abi_cxx11_(&local_1d8,(url *)local_138);
        run(this,&local_1b8,&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1b8);
        url::~url((url *)local_138);
        std::__cxx11::string::~string((string *)local_40);
        return false;
      }
    }
  }
  result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  ::result(&local_2d0,result);
  std::
  function<void_(m2d::savanna::result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>)>
  ::operator()(&this->completion_,&local_2d0);
  result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  ::~result(&local_2d0);
  return true;
}

Assistant:

bool completion_callback(savanna::result<http::response<http::dynamic_body>> result) override {
			if (!result.error) {
				if ((result.response->result_int() >= 300) && result.response->result_int() < 400 && follow_location_) {
					auto location = result.response->base()["Location"].to_string();
					auto new_url = savanna::url(location);
					update_request(original_request_, new_url.to_string(), new_url.host());
					run(new_url.host(), new_url.port_str());
					return false;
				}
			}
			completion_(result);
			return true;
		}